

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

void ppsum(double *u,int n,int l,double *sum)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  if (l < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    uVar2 = 1;
    lVar3 = 8;
    do {
      dVar6 = 0.0;
      pdVar1 = u;
      uVar4 = (ulong)(uint)n;
      if ((long)uVar2 < (long)n) {
        do {
          dVar6 = dVar6 + *(double *)((long)pdVar1 + lVar3) * *pdVar1;
          uVar4 = uVar4 - 1;
          pdVar1 = pdVar1 + 1;
        } while (uVar2 != uVar4);
      }
      dVar5 = dVar5 + (1.0 - (double)(int)uVar2 / ((double)l + 1.0)) * dVar6;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar2 != l + 1);
  }
  *sum = dVar5 / (double)n + dVar5 / (double)n + *sum;
  return;
}

Assistant:

void ppsum(double* u, int n, int l, double* sum)
{
	/* Copyright (C) 1997-2000  Adrian Trapletti 
	efficient computation of the sums involved in the Phillips-Perron tests */
  int i, j;
  double tmp1, tmp2;

  //printf("%d %d %g \n ",n,l,*sum);
  
  tmp1 = 0.0;
  for (i=1; i<= l; i++)
  {
    tmp2 = 0.0;
    for (j=i; j< n; j++)  
    {
      tmp2 += (u[j]*u[j-i]);
    }
    tmp2 *= 1.0-((double)i/((double) l +1.0));
    tmp1 += tmp2;
  }
  tmp1 /= (double) n;
  tmp1 *= 2.0;
  (*sum) += tmp1;
}